

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O2

Image * Unit_Test::randomImage
                  (Image *__return_storage_ptr__,
                  vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  pointer puVar1;
  uint uVar2;
  uint32_t width_;
  uint32_t height_;
  uint uVar3;
  uchar *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uchar *puVar9;
  ulong uVar10;
  ulong uVar11;
  
  if ((value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    randomImage(__return_storage_ptr__,0,0);
    return __return_storage_ptr__;
  }
  width_ = anon_unknown.dwarf_18be5e::randomSize();
  height_ = anon_unknown.dwarf_18be5e::randomSize();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (__return_storage_ptr__,width_,height_,'\x01','\x01');
  uVar2 = __return_storage_ptr__->_width;
  uVar6 = (ulong)uVar2;
  uVar8 = __return_storage_ptr__->_height;
  uVar7 = (long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 < uVar7) {
    uVar3 = __return_storage_ptr__->_rowSize;
  }
  else {
    uVar3 = __return_storage_ptr__->_rowSize;
    if (uVar3 == uVar2 && (int)(uVar6 % (uVar7 & 0xffffffff)) == 0) {
      uVar3 = 1;
      if (uVar2 < (uint)(0xffffffff / (ulong)uVar8)) {
        uVar3 = uVar8;
        uVar8 = 1;
      }
      uVar11 = (ulong)(uVar3 * uVar2);
      uVar5 = uVar6;
      goto LAB_0012e0ba;
    }
  }
  uVar5 = (ulong)uVar3;
  uVar11 = uVar6;
LAB_0012e0ba:
  puVar4 = __return_storage_ptr__->_data;
  uVar6 = 0;
  puVar9 = puVar4 + uVar8 * (int)uVar5;
  for (; puVar4 != puVar9; puVar4 = puVar4 + uVar5) {
    for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      puVar1 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar6;
      uVar6 = uVar6 + 1;
      puVar4[uVar10] = *puVar1;
      if (uVar6 == uVar7) {
        uVar6 = 0;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PenguinV_Image::Image randomImage( const std::vector <uint8_t> & value )
    {
        if( value.empty() )
            return randomImage();

        PenguinV_Image::Image image( randomSize(), randomSize() );

        uint32_t height = image.height();
        uint32_t width = image.width();

        const size_t valueSize = value.size();

        if ( valueSize <= width && (width % static_cast<uint32_t>(valueSize)) == 0 )
            Image_Function::OptimiseRoi( width, height, image );

        const uint32_t rowSize  = image.rowSize();
        uint8_t * outY          = image.data();
        const uint8_t * outYEnd = outY + height * rowSize;

        size_t id = 0;

        for ( ; outY != outYEnd; outY += rowSize ) {
            uint8_t * outX = outY;
            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX ) {
                (*outX) = value[id++];
                if ( id == valueSize )
                    id = 0u;
            }
        }

        return image;
    }